

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::BufferedMessageStream::readEntireMessage
          (BufferedMessageStream *this,ArrayPtr<const_unsigned_char> prefix,
          size_t expectedSizeInWords,ArrayPtr<kj::OwnFd> fdSpace,size_t fdsSoFar,
          ReaderOptions options)

{
  _func_int *p_Var1;
  SourceLocation location;
  undefined8 uVar2;
  undefined8 uVar3;
  word *__dest;
  void *pvVar4;
  size_t fdBuffer;
  ArrayDisposer *count;
  size_t sVar5;
  SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:808:13)>
  *location_00;
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Fault f;
  Array<capnp::word> msgBuffer;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  undefined1 local_f8 [104];
  undefined1 local_90 [32];
  OwnFd *local_70;
  uint64_t uStack_68;
  size_t local_60;
  uint64_t local_58;
  size_t local_48;
  ArrayDisposer *local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  sVar5 = fdSpace.size_;
  count = (ArrayDisposer *)fdSpace.ptr;
  local_f8._88_8_ = prefix.ptr;
  local_90._8_8_ = &options.nestingLimit;
  local_90._0_8_ = &stack0xffffffffffffffc0;
  local_90._16_8_ = " <= ";
  local_90._24_8_ = &DAT_00000005;
  local_70 = (OwnFd *)CONCAT71(local_70._1_7_,count <= (ulong)options._8_8_);
  local_f8._80_8_ = this;
  local_40 = count;
  if (count <= (ulong)options._8_8_) {
    __dest = kj::_::HeapArrayDisposer::allocate<capnp::word>((size_t)count);
    local_f8._64_8_ = &kj::_::HeapArrayDisposer::instance;
    local_f8._48_8_ = __dest;
    local_f8._56_8_ = count;
    memcpy(__dest,(void *)prefix.size_,expectedSizeInWords);
    uVar2 = local_f8._88_8_;
    fdBuffer = (long)count * 8 - expectedSizeInWords;
    tryReadWithFds((BufferedMessageStream *)local_f8,(void *)local_f8._88_8_,
                   (long)&__dest->content + expectedSizeInWords,fdBuffer,(OwnFd *)fdBuffer,
                   sVar5 * 4 + fdsSoFar);
    local_90._0_8_ = uVar2;
    local_90._24_8_ = &kj::_::HeapArrayDisposer::instance;
    local_f8._48_8_ = 0;
    local_f8._56_8_ = (ArrayDisposer *)0x0;
    local_70 = (OwnFd *)fdsSoFar;
    uStack_68 = options.traversalLimitInWords;
    local_58 = options._8_8_;
    local_f8._16_8_ =
         kj::_::
         SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:808:13)>
         ::anon_class_80_6_c22dae31_for_func::operator();
    p_Var1 = *(_func_int **)(local_f8._0_8_ + 8);
    local_90._8_8_ = __dest;
    local_90._16_8_ = count;
    local_60 = sVar5;
    local_48 = fdBuffer;
    if (p_Var1 == (_func_int *)0x0 || (ulong)(local_f8._0_8_ - (long)p_Var1) < 0x70) {
      pvVar4 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:808:13)>
                     *)((long)pvVar4 + 0x390);
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,capnp::BufferedMessageStream::readEntireMessage(kj::ArrayPtr<unsigned_char_const>,unsigned_long,kj::ArrayPtr<kj::OwnFd>,unsigned_long,capnp::ReaderOptions)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::BufferedMessageStream::readEntireMessage(kj::ArrayPtr<unsigned_char_const>,unsigned_long,kj::ArrayPtr<kj::OwnFd>,unsigned_long,capnp::ReaderOptions)::__0,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f8,
                 (anon_class_80_6_c22dae31_for_func *)local_90,(void **)(local_f8 + 0x10));
      *(void **)((long)pvVar4 + 0x398) = pvVar4;
    }
    else {
      *(_func_int **)(local_f8._0_8_ + 8) = (_func_int *)0x0;
      location_00 = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:808:13)>
                     *)(local_f8._0_8_ + -0x70);
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,capnp::BufferedMessageStream::readEntireMessage(kj::ArrayPtr<unsigned_char_const>,unsigned_long,kj::ArrayPtr<kj::OwnFd>,unsigned_long,capnp::ReaderOptions)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::BufferedMessageStream::readEntireMessage(kj::ArrayPtr<unsigned_char_const>,unsigned_long,kj::ArrayPtr<kj::OwnFd>,unsigned_long,capnp::ReaderOptions)::__0,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f8,
                 (anon_class_80_6_c22dae31_for_func *)local_90,(void **)(local_f8 + 0x10));
      *(_func_int **)(local_f8._0_8_ + -0x68) = p_Var1;
    }
    local_f8._24_8_ = &DAT_0042a172;
    local_f8._32_8_ = &DAT_0042a1d1;
    local_f8._40_8_ = (word *)0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_f8._8_8_ = location_00;
    kj::_::maybeChain<kj::Maybe<capnp::MessageReaderAndFds>>
              ((OwnPromiseNode *)(local_f8 + 0x60),
               (Promise<kj::Maybe<capnp::MessageReaderAndFds>_> *)(local_f8 + 8),location);
    uVar3 = local_f8._96_8_;
    local_f8._96_8_ = (OwnFd *)0x0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_f8 + 0x60));
    uVar2 = local_f8._80_8_;
    *(undefined8 *)local_f8._80_8_ = uVar3;
    local_38.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffc8);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_f8 + 8));
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)(local_90 + 8));
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f8);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)(local_f8 + 0x30));
    return (Promise<kj::Maybe<capnp::MessageReaderAndFds>_>)(PromiseNode *)uVar2;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[40]>
            ((Fault *)(local_f8 + 0x18),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++"
             ,0x319,FAILED,"expectedSizeInWords <= options.traversalLimitInWords",
             "_kjCondition,\"incoming RPC message exceeds size limit\"",
             (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_90,
             (char (*) [40])"incoming RPC message exceeds size limit");
  kj::_::Debug::Fault::fatal((Fault *)(local_f8 + 0x18));
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> BufferedMessageStream::readEntireMessage(
    kj::ArrayPtr<const byte> prefix, size_t expectedSizeInWords,
    kj::ArrayPtr<kj::OwnFd> fdSpace, size_t fdsSoFar,
    ReaderOptions options) {
  KJ_REQUIRE(expectedSizeInWords <= options.traversalLimitInWords,
      "incoming RPC message exceeds size limit");

  auto msgBuffer = kj::heapArray<word>(expectedSizeInWords);

  memcpy(msgBuffer.asBytes().begin(), prefix.begin(), prefix.size());

  size_t bytesRemaining = msgBuffer.asBytes().size() - prefix.size();

  // TODO(perf): If we had scatter-read API support, we could optimistically try to read additional
  //   bytes into the shared buffer, to save syscalls when a big message is immediately followed
  //   by small messages.
  auto promise = tryReadWithFds(
      msgBuffer.asBytes().begin() + prefix.size(), bytesRemaining, bytesRemaining,
      fdSpace.begin() + fdsSoFar, fdSpace.size() - fdsSoFar);
  return promise
      .then([this, msgBuffer = kj::mv(msgBuffer), fdSpace, fdsSoFar, options, bytesRemaining]
            (kj::AsyncCapabilityStream::ReadResult result) mutable
            -> kj::Promise<kj::Maybe<MessageReaderAndFds>> {
    fdsSoFar += result.capCount;

    if (result.byteCount < bytesRemaining) {
      // Received EOF during message.
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      return kj::Maybe<MessageReaderAndFds>(kj::none);
    }

    size_t newExpectedSize = expectedSizeInWordsFromPrefix(msgBuffer);
    if (newExpectedSize > msgBuffer.size()) {
      // Unfortunately, the predicted size increased. This can happen if the segment table had
      // not been fully received when we generated the first prediction. This should be rare
      // (most segment tables are small and should be received all at once), but in this case we
      // will need to make a whole new copy of the message.
      //
      // We recurse here, but this should never recurse more than once, since we should always
      // have the entire segment table by this point and therefore the expected size is now final.
      //
      // TODO(perf): Technically it's guaranteed that the original expectation should have stopped
      //   at the boundary between two segments, so with a clever MesnsageReader implementation
      //   we could actually read the rest of the message into a second buffer, avoiding the copy.
      //   Unclear if it's worth the effort to implement this.
      return readEntireMessage(msgBuffer.asBytes(), newExpectedSize, fdSpace, fdsSoFar, options);
    }

    return kj::Maybe<MessageReaderAndFds>(MessageReaderAndFds {
      kj::heap<MessageReaderImpl>(kj::mv(msgBuffer), options),
      fdSpace.first(fdsSoFar)
    });
  });
}